

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O1

FT_Error af_latin_metrics_init(AF_LatinMetrics metrics,FT_Face face)

{
  char *pcVar1;
  ushort uVar2;
  AF_Blue_Stringset AVar3;
  uint uVar4;
  FT_Memory memory_00;
  FT_GlyphSlot_conflict pFVar5;
  long lVar6;
  long *plVar7;
  uint uVar8;
  AF_LatinMetrics metrics_00;
  AF_LatinAxisRec *pAVar9;
  FT_Error FVar10;
  AF_Blue_String AVar11;
  uint uVar12;
  long *plVar13;
  AF_StyleClass *p;
  undefined4 extraout_var;
  long lVar14;
  FT_Pos *pFVar15;
  FT_Pos FVar16;
  AF_LatinBlueRec *pAVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  FT_CharMap charmap;
  bool bVar24;
  ushort uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  FT_UInt FVar31;
  uint uVar32;
  uint uVar33;
  long *plVar34;
  uint uVar35;
  long lVar36;
  long *plVar37;
  long lVar38;
  FT_Face pFVar39;
  FT_Memory memory;
  int iVar40;
  uint uVar41;
  char *pcVar42;
  long lVar43;
  bool bVar44;
  bool bVar45;
  AF_StyleClass pAStack_c3d8;
  AF_LatinMetricsRec dummy [1];
  AF_GlyphHintsRec hints [1];
  uint local_178 [2];
  uint num_idx_1;
  long local_128;
  long local_120;
  ulong local_118;
  ulong local_110;
  long local_108;
  ulong local_100;
  AF_LatinBlueRec *local_f8;
  FT_CharMap local_f0;
  FT_Vector *local_e8;
  char *local_e0;
  FT_UInt local_d4;
  ulong local_d0;
  FT_GlyphSlot_conflict local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  long *local_98;
  AF_Blue_StringRec *local_90;
  uint local_84;
  FT_Vector *local_80;
  FT_Face local_78;
  AF_LatinMetrics local_70;
  uint local_64;
  FT_UInt local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  FT_Pos *local_50;
  bool local_41;
  undefined8 local_40;
  uint local_34;
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar10 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar10 == 0) {
    memory_00 = face->memory;
    lVar27 = 0;
    local_f0 = charmap;
    local_78 = face;
    memset(&dummy[0].axis[1].org_delta,0,0x1438);
    local_40 = metrics->axis;
    metrics->axis[0].width_count = 0;
    metrics->axis[1].width_count = 0;
    pcVar42 = af_script_classes[((metrics->root).style_class)->script]->standard_charstring;
    dummy[0].axis[1].org_delta = (FT_Pos)memory_00;
    plVar13 = (long *)ft_mem_alloc(memory_00,8,(FT_Error *)&pAStack_c3d8);
    do {
      if (*pcVar42 == '\0') break;
      pcVar42 = pcVar42 + -1;
      do {
        pcVar1 = pcVar42 + 1;
        pcVar42 = pcVar42 + 1;
      } while (*pcVar1 == ' ');
      pcVar42 = af_shaper_get_cluster(pcVar42,&metrics->root,plVar13,(uint *)&pAStack_c3d8);
      if ((uint)pAStack_c3d8 < 2) {
        lVar27 = *plVar13;
        bVar45 = lVar27 != 0;
      }
      else {
        bVar45 = false;
      }
    } while (!bVar45);
    ft_mem_free(local_78->memory,plVar13);
    local_70 = metrics;
    if (((lVar27 != 0) && (FVar10 = FT_Load_Glyph(local_78,(FT_UInt)lVar27,1), FVar10 == 0)) &&
       (pFVar5 = local_78->glyph, 0 < (pFVar5->outline).n_points)) {
      memset(&pAStack_c3d8,0,0x8fe0);
      dummy[0].root.globals._0_4_ = metrics->units_per_em;
      dummy[0].root.scaler.face = (FT_Face)0x10000;
      dummy[0].root.scaler.x_scale = 0x10000;
      dummy[0].root.scaler.y_scale = 0;
      dummy[0].root.scaler.x_delta = 0;
      dummy[0].root.style_class = (AF_StyleClass)local_78;
      dummy[0].root.scaler.y_delta = 0;
      hints[0].axis[1].embedded.edges[0xb].last._0_4_ = 0;
      hints[0]._5144_8_ = &pAStack_c3d8;
      FVar10 = af_glyph_hints_reload((AF_GlyphHints)&dummy[0].axis[1].org_delta,&pFVar5->outline);
      if (FVar10 == 0) {
        pFVar15 = &dummy[0].axis[1].org_delta;
        lVar27 = 0;
        do {
          local_178[0] = 0;
          FVar10 = af_latin_hints_compute_segments((AF_GlyphHints)pFVar15,(AF_Dimension)lVar27);
          pAVar9 = local_40;
          if (FVar10 != 0) break;
          FVar31 = 0;
          af_latin_hints_link_segments
                    ((AF_GlyphHints)pFVar15,0,(AF_WidthRec *)0x0,(AF_Dimension)lVar27);
          lVar30 = (long)*(int *)&hints[0].axis[lVar27 + -1].embedded.edges[0xb].last;
          if (0 < lVar30) {
            uVar21 = *(ulong *)(hints[0].axis + lVar27);
            uVar28 = lVar30 * 0x50 + uVar21;
            FVar31 = 0;
            do {
              uVar29 = *(ulong *)(uVar21 + 0x20);
              if ((uVar29 != 0) &&
                 ((FVar31 < 0x10 && uVar21 < uVar29) && uVar21 == *(ulong *)(uVar29 + 0x20))) {
                iVar40 = (int)*(short *)(uVar21 + 2) - (int)*(short *)(uVar29 + 2);
                uVar2 = (ushort)iVar40;
                uVar25 = -uVar2;
                if (0 < iVar40) {
                  uVar25 = uVar2;
                }
                uVar29 = (ulong)FVar31;
                FVar31 = FVar31 + 1;
                pAVar9[lVar27].widths[uVar29].org = (ulong)uVar25;
              }
              uVar21 = uVar21 + 0x50;
            } while (uVar21 < uVar28);
          }
          local_178[0] = FVar31;
          af_sort_and_quantize_widths
                    (local_178,pAVar9[lVar27].widths,(ulong)(FT_UInt)dummy[0].root.globals / 100);
          pAVar9[lVar27].width_count = local_178[0];
          bVar45 = lVar27 == 0;
          lVar27 = lVar27 + 1;
          metrics = local_70;
        } while (bVar45);
      }
    }
    pFVar39 = local_78;
    lVar27 = 0x1f8;
    do {
      if (*(int *)((long)metrics + lVar27 + -0x198) == 0) {
        uVar21 = (ulong)metrics->units_per_em * 0x32 >> 0xb;
      }
      else {
        uVar21 = *(ulong *)((long)metrics + lVar27 + -400);
      }
      *(long *)((long)(metrics->axis[0].widths + -5) + lVar27) = (long)uVar21 / 5;
      *(ulong *)((long)metrics->axis[0].widths + lVar27 + -0x70) = uVar21;
      *(undefined1 *)((long)metrics->axis[0].widths + lVar27 + -0x68) = 0;
      lVar27 = lVar27 + 0x47c8;
    } while (lVar27 == 0x49c0);
    af_glyph_hints_done((AF_GlyphHints)&dummy[0].axis[1].org_delta);
    AVar3 = ((metrics->root).style_class)->blue_stringset;
    uVar35 = metrics->units_per_em;
    local_98 = (long *)ft_mem_alloc(pFVar39->memory,8,(FT_Error *)&pAStack_c3d8);
    AVar11 = af_blue_stringsets[AVar3].string;
    if (AVar11 != AF_BLUE_STRING_MAX) {
      local_90 = af_blue_stringsets + AVar3;
      local_100 = (ulong)(uVar35 >> 1) / 7;
      local_f8 = local_70->axis[1].blues;
      do {
        if (af_blue_strings[AVar11] == '\0') {
          lVar27 = 0;
          lVar30 = 0;
          local_b0 = 0;
          local_a8 = 0;
        }
        else {
          pcVar42 = af_blue_strings + AVar11;
          local_a8 = 0;
          local_b0 = 0;
          lVar30 = 0;
          lVar27 = 0;
          plVar13 = local_98;
          do {
            pcVar42 = pcVar42 + -1;
            do {
              pcVar1 = pcVar42 + 1;
              pcVar42 = pcVar42 + 1;
            } while (*pcVar1 == ' ');
            pcVar42 = af_shaper_get_cluster(pcVar42,&local_70->root,plVar13,local_178);
            local_d4 = local_178[0];
            if (local_178[0] != 0) {
              local_e0 = pcVar42;
              local_64 = (uint)local_90->properties;
              lVar43 = -0x80000000;
              if ((local_90->properties & 1) == 0) {
                lVar43 = 0x7fffffff;
              }
              FVar31 = 0;
              uVar35 = 0;
              do {
                if (((*plVar13 != 0) &&
                    (local_60 = FVar31, local_5c = uVar35,
                    FVar10 = FT_Load_Glyph(pFVar39,(FT_UInt)*plVar13,1), FVar31 = local_60,
                    uVar35 = local_5c, FVar10 == 0)) &&
                   (pFVar5 = pFVar39->glyph, 2 < (pFVar5->outline).n_points)) {
                  local_b8 = lVar43;
                  local_80 = (pFVar5->outline).points;
                  lVar36 = (long)(pFVar5->outline).n_contours;
                  local_c8 = pFVar5;
                  if (lVar36 < 1) {
                    lVar14 = 0;
                    uVar20 = 0xffffffff;
                    local_40 = (AF_LatinAxisRec *)((ulong)local_40._4_4_ << 0x20);
                    local_34 = 0;
                  }
                  else {
                    local_50 = &local_80->y;
                    lVar23 = 0;
                    uVar20 = 0xffffffff;
                    local_34 = 0;
                    local_40 = (AF_LatinAxisRec *)((ulong)local_40._4_4_ << 0x20);
                    uVar41 = 0;
                    lVar14 = 0;
                    do {
                      iVar40 = (int)(pFVar5->outline).contours[lVar23];
                      if ((int)uVar41 < iVar40) {
                        lVar38 = (long)(int)uVar41;
                        uVar12 = uVar20;
                        if ((local_64 & 3) == 0) {
                          pFVar15 = local_50 + lVar38 * 2;
                          lVar38 = (iVar40 - lVar38) + 1;
                          uVar18 = uVar41;
                          do {
                            if (((int)uVar12 < 0) || (lVar6 = *pFVar15, lVar6 < lVar14)) {
                              lVar14 = *pFVar15;
                              uVar12 = uVar18;
                              if (lVar14 <= lVar27) {
                                lVar27 = lVar14;
                              }
                            }
                            else if (lVar30 <= lVar6) {
                              lVar30 = lVar6;
                            }
                            uVar18 = uVar18 + 1;
                            pFVar15 = pFVar15 + 2;
                            lVar38 = lVar38 + -1;
                          } while (lVar38 != 0);
                        }
                        else {
                          pFVar15 = local_50 + lVar38 * 2;
                          lVar38 = (iVar40 - lVar38) + 1;
                          uVar18 = uVar41;
                          do {
                            if (((int)uVar12 < 0) || (lVar6 = *pFVar15, lVar14 < lVar6)) {
                              lVar14 = *pFVar15;
                              uVar12 = uVar18;
                              if (lVar30 <= lVar14) {
                                lVar30 = lVar14;
                              }
                            }
                            else if (lVar6 <= lVar27) {
                              lVar27 = lVar6;
                            }
                            uVar18 = uVar18 + 1;
                            pFVar15 = pFVar15 + 2;
                            lVar38 = lVar38 + -1;
                          } while (lVar38 != 0);
                        }
                        iVar19 = (uint)local_40;
                        if (uVar12 != uVar20) {
                          iVar19 = iVar40;
                        }
                        local_40 = (AF_LatinAxisRec *)CONCAT44(local_40._4_4_,iVar19);
                        if (uVar12 != uVar20) {
                          local_34 = uVar41;
                        }
                        uVar20 = uVar12;
                      }
                      uVar41 = iVar40 + 1;
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != lVar36);
                  }
                  pFVar39 = local_78;
                  plVar13 = local_98;
                  if ((int)uVar20 < 0) {
                    bVar45 = false;
                  }
                  else {
                    local_50 = (FT_Pos *)(pFVar5->outline).tags;
                    local_c0 = local_80[uVar20].x;
                    uVar41 = 0xffffffff;
                    if ((*(byte *)((long)local_50 + (ulong)uVar20) & 3) == 1) {
                      uVar41 = uVar20;
                    }
                    uVar12 = uVar41;
                    uVar18 = uVar20;
                    do {
                      uVar4 = uVar18 - 1;
                      if ((int)uVar18 <= (int)local_34) {
                        uVar4 = (uint)local_40;
                      }
                      lVar36 = (long)(int)uVar4;
                      uVar28 = local_80[lVar36].y - lVar14;
                      uVar21 = -uVar28;
                      if (0 < (long)uVar28) {
                        uVar21 = uVar28;
                      }
                      uVar26 = uVar20;
                      if (5 < uVar21) {
                        uVar29 = local_80[lVar36].x - local_c0;
                        uVar28 = -uVar29;
                        if (0 < (long)uVar29) {
                          uVar28 = uVar29;
                        }
                        if (uVar28 <= uVar21 * 0x14) break;
                      }
                      uVar18 = uVar12;
                      if ((int)uVar12 < 0) {
                        uVar18 = uVar4;
                      }
                      if ((*(byte *)((long)local_50 + lVar36) & 3) == 1) {
                        uVar12 = uVar18;
                        uVar41 = uVar4;
                      }
                      uVar18 = uVar4;
                    } while (uVar4 != uVar20);
                    do {
                      uVar4 = uVar26 + 1;
                      if ((int)(uint)local_40 <= (int)uVar26) {
                        uVar4 = local_34;
                      }
                      lVar36 = (long)(int)uVar4;
                      local_c8 = (FT_GlyphSlot_conflict)(local_80 + lVar36);
                      uVar28 = local_80[lVar36].y - lVar14;
                      uVar21 = -uVar28;
                      if (0 < (long)uVar28) {
                        uVar21 = uVar28;
                      }
                      if (5 < uVar21) {
                        uVar29 = (long)local_c8->library - local_c0;
                        uVar28 = -uVar29;
                        if (0 < (long)uVar29) {
                          uVar28 = uVar29;
                        }
                        if (uVar28 <= uVar21 * 0x14) break;
                      }
                      uVar26 = uVar41;
                      if ((int)uVar41 < 0) {
                        uVar26 = uVar4;
                      }
                      if ((*(byte *)((long)local_50 + lVar36) & 3) == 1) {
                        uVar12 = uVar4;
                        uVar41 = uVar26;
                      }
                      uVar26 = uVar4;
                    } while (uVar4 != uVar20);
                    if ((local_64 & 0x10) == 0) {
LAB_0023b809:
                      if (((int)uVar41 < 0) || ((int)uVar12 < 0)) {
LAB_0023b844:
                        bVar45 = true;
                        if ((*(byte *)((long)local_50 + (long)(int)uVar18) & 3) == 1) {
                          bVar45 = (*(byte *)((long)local_50 + (long)(int)uVar26) & 3) != 1;
                        }
                      }
                      else {
                        uVar28 = local_80[uVar12].x - local_80[uVar41].x;
                        uVar21 = -uVar28;
                        if (0 < (long)uVar28) {
                          uVar21 = uVar28;
                        }
                        if (uVar21 <= local_100) goto LAB_0023b844;
                        bVar45 = false;
                      }
                      bVar24 = bVar45 == false || (local_64 & 4) == 0;
                    }
                    else {
                      uVar4 = local_70->units_per_em;
                      local_d0 = (ulong)uVar4;
                      local_110 = (ulong)uVar4 / 0x19;
                      uVar28 = local_80[(int)uVar26].x - local_80[(int)uVar18].x;
                      uVar21 = -uVar28;
                      if (0 < (long)uVar28) {
                        uVar21 = uVar28;
                      }
                      bVar44 = true;
                      if ((uVar21 < local_110) &&
                         (uVar22 = uVar20,
                         (int)((uVar26 - uVar18) + 2) <= (int)((uint)local_40 - local_34))) {
                        do {
                          uVar8 = uVar22 - 1;
                          if ((int)uVar22 <= (int)local_34) {
                            uVar8 = (uint)local_40;
                          }
                          lVar36 = local_80[(int)uVar8].x;
                        } while ((lVar36 == local_c0) && (uVar22 = uVar8, uVar8 != uVar20));
                        if (uVar8 != uVar20) {
                          local_108 = lVar36;
                          local_d0 = (ulong)(uVar4 >> 2);
                          bVar45 = false;
                          local_58 = uVar26;
                          uVar32 = 0;
                          local_54 = 0;
                          local_84 = uVar20;
                          uVar22 = uVar26;
                          do {
                            if (!bVar45) {
                              uVar32 = 0xffffffff;
                              if ((*(byte *)((long)local_50 + (long)(int)uVar22) & 3) == 1) {
                                uVar32 = uVar22;
                              }
                              local_58 = uVar22;
                              local_54 = uVar32;
                            }
                            local_a0 = CONCAT44(local_a0._4_4_,uVar32);
                            bVar45 = (int)(uint)local_40 <= (int)uVar22;
                            uVar22 = uVar22 + 1;
                            if (bVar45) {
                              uVar22 = local_34;
                            }
                            lVar23 = local_80[(int)local_58].y;
                            uVar28 = lVar14 - lVar23;
                            uVar21 = -uVar28;
                            if (0 < (long)uVar28) {
                              uVar21 = uVar28;
                            }
                            if (uVar4 >> 2 < uVar21) {
LAB_0023b94c:
                              bVar44 = false;
                              bVar45 = false;
                            }
                            else {
                              local_128 = (long)(int)uVar22;
                              local_e8 = local_80 + local_128;
                              local_120 = lVar23;
                              uVar28 = local_80[local_128].y - lVar23;
                              uVar21 = -uVar28;
                              if (0 < (long)uVar28) {
                                uVar21 = uVar28;
                              }
                              if (5 < uVar21) {
                                uVar29 = local_e8->x - local_80[(int)local_58].x;
                                uVar28 = -uVar29;
                                if (0 < (long)uVar29) {
                                  uVar28 = uVar29;
                                }
                                if (uVar28 <= uVar21 * 0x14) goto LAB_0023b94c;
                              }
                              local_118 = uVar21;
                              local_41 = lVar36 < local_c0;
                              uVar33 = uVar32;
                              if ((int)uVar32 < 0) {
                                uVar33 = uVar22;
                              }
                              if ((*(byte *)((long)local_50 + local_128) & 3) == 1) {
                                local_54 = uVar22;
                                uVar32 = uVar33;
                              }
                              local_a0 = local_80[(int)local_58].x;
                              uVar29 = local_e8->x - local_a0;
                              uVar28 = -uVar29;
                              if (0 < (long)uVar29) {
                                uVar28 = uVar29;
                              }
                              bVar44 = false;
                              bVar45 = true;
                              if (((uVar29 != 0 && local_a0 <= local_e8->x) == lVar36 < local_c0) &&
                                 (local_110 <= uVar28)) {
                                uVar12 = local_54;
                                do {
                                  bVar45 = (int)(uint)local_40 <= (int)uVar22;
                                  uVar22 = uVar22 + 1;
                                  if (bVar45) {
                                    uVar22 = local_34;
                                  }
                                  uVar29 = local_80[(int)uVar22].y - lVar23;
                                  uVar28 = -uVar29;
                                  if (0 < (long)uVar29) {
                                    uVar28 = uVar29;
                                  }
                                  if (5 < uVar28) {
                                    uVar29 = (long)local_c8->library - local_a0;
                                    uVar28 = -uVar29;
                                    if (0 < (long)uVar29) {
                                      uVar28 = uVar29;
                                    }
                                    if (uVar28 <= uVar21 * 0x14) {
                                      bVar45 = (int)uVar22 <= (int)local_34;
                                      uVar22 = uVar22 - 1;
                                      if (bVar45) {
                                        uVar22 = (uint)local_40;
                                      }
                                      bVar44 = true;
                                      local_54 = uVar12;
                                      bVar45 = true;
                                      lVar14 = lVar23;
                                      uVar26 = uVar22;
                                      uVar41 = uVar32;
                                      uVar18 = local_58;
                                      goto LAB_0023b958;
                                    }
                                  }
                                  uVar41 = uVar32;
                                  if ((int)uVar32 < 0) {
                                    uVar41 = uVar22;
                                  }
                                  if ((*(byte *)((long)local_50 + (long)(int)uVar22) & 3) == 1) {
                                    uVar32 = uVar41;
                                  }
                                  uVar12 = uVar22;
                                } while (uVar22 != uVar18);
                                bVar44 = true;
                                bVar45 = true;
                                local_54 = uVar22;
                                lVar14 = local_120;
                                uVar26 = uVar22;
                                uVar41 = uVar32;
                                uVar18 = local_58;
                              }
                            }
LAB_0023b958:
                          } while ((!bVar44) && (uVar22 != uVar18));
                        }
                        bVar44 = uVar8 != uVar20;
                      }
                      bVar24 = false;
                      bVar45 = false;
                      if (bVar44) goto LAB_0023b809;
                    }
                    if (!bVar24) goto LAB_0023b8a8;
                  }
                  uVar35 = local_5c & 0xff;
                  if ((local_64 & 1) == 0) {
                    if (lVar14 < lVar43) {
                      lVar43 = lVar14;
                      uVar35 = (uint)bVar45;
                    }
                  }
                  else if (lVar43 < lVar14) {
                    lVar43 = lVar14;
                    uVar35 = (uint)bVar45;
                  }
                }
LAB_0023b8a8:
                FVar31 = FVar31 + 1;
              } while (FVar31 != local_d4);
              pcVar42 = local_e0;
              if ((lVar43 != -0x80000000) && (lVar43 != 0x7fffffff)) {
                if ((char)uVar35 == '\0') {
                  uVar35 = (uint)local_a8;
                  pFVar15 = (FT_Pos *)&pAStack_c3d8;
                  local_a8 = (ulong)(uVar35 + 1);
                }
                else {
                  uVar35 = (uint)local_b0;
                  pFVar15 = &dummy[0].axis[1].org_delta;
                  local_b0 = (ulong)(uVar35 + 1);
                }
                pFVar15[uVar35] = lVar43;
              }
            }
          } while (*pcVar42 != '\0');
        }
        uVar20 = (uint)local_a8;
        uVar35 = (uint)local_b0;
        if (uVar20 != 0 || uVar35 != 0) {
          if (1 < uVar35) {
            uVar41 = 1;
            do {
              uVar21 = (ulong)uVar41;
              do {
                lVar43 = *(long *)((long)hints[0].axis[0].embedded.segments + uVar21 * 8 + -0x78);
                uVar28 = (ulong)((int)uVar21 - 1);
                lVar36 = *(long *)((long)hints[0].axis[0].embedded.segments + uVar28 * 8 + -0x78);
                if (lVar36 <= lVar43) break;
                *(long *)((long)hints[0].axis[0].embedded.segments + uVar21 * 8 + -0x78) = lVar36;
                *(long *)((long)hints[0].axis[0].embedded.segments + uVar28 * 8 + -0x78) = lVar43;
                uVar21 = uVar28;
              } while (uVar28 != 0);
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar35);
          }
          if (1 < uVar20) {
            uVar41 = 1;
            do {
              uVar21 = (ulong)uVar41;
              do {
                lVar43 = *(long *)((long)dummy[0].axis[0].widths + uVar21 * 8 + -0x70);
                uVar28 = (ulong)((int)uVar21 - 1);
                lVar36 = *(long *)((long)dummy[0].axis[0].widths + uVar28 * 8 + -0x70);
                if (lVar36 <= lVar43) break;
                *(long *)((long)dummy[0].axis[0].widths + uVar21 * 8 + -0x70) = lVar36;
                *(long *)((long)dummy[0].axis[0].widths + uVar28 * 8 + -0x70) = lVar43;
                uVar21 = uVar28;
              } while (uVar28 != 0);
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar20);
          }
          uVar41 = local_70->axis[1].blue_count;
          pAVar17 = local_f8 + uVar41;
          local_70->axis[1].blue_count = uVar41 + 1;
          if (uVar20 == 0) {
            FVar16 = *(FT_Pos *)
                      ((long)hints[0].axis[0].embedded.segments + (ulong)(uVar35 >> 1) * 8 + -0x78);
LAB_0023bcb3:
            (pAVar17->shoot).org = FVar16;
            (pAVar17->ref).org = FVar16;
          }
          else {
            FVar16 = *(FT_Pos *)((long)dummy[0].axis[0].widths + (ulong)(uVar20 >> 1) * 8 + -0x70);
            if (uVar35 == 0) goto LAB_0023bcb3;
            (pAVar17->ref).org = FVar16;
            (pAVar17->shoot).org =
                 *(FT_Pos *)
                  ((long)hints[0].axis[0].embedded.segments + (ulong)(uVar35 >> 1) * 8 + -0x78);
          }
          lVar43 = (pAVar17->ref).org;
          lVar36 = (pAVar17->shoot).org;
          if ((lVar36 != lVar43) && (lVar36 <= lVar43 == ((local_90->properties & 3) != 0))) {
            lVar43 = (lVar43 + lVar36) / 2;
            (pAVar17->shoot).org = lVar43;
            (pAVar17->ref).org = lVar43;
          }
          pAVar17->ascender = lVar30;
          pAVar17->descender = lVar27;
          uVar2 = local_90->properties;
          pAVar17->flags = (uint)uVar2 + (uint)uVar2 & 0xe;
          if ((uVar2 & 8) != 0) {
            *(byte *)&pAVar17->flags = (byte)pAVar17->flags | 0x10;
          }
        }
        AVar11 = local_90[1].string;
        local_90 = local_90 + 1;
      } while (AVar11 != AF_BLUE_STRING_MAX);
    }
    ft_mem_free(pFVar39->memory,local_98);
    uVar35 = local_70->axis[1].blue_count;
    if ((ulong)uVar35 != 0) {
      pAVar17 = local_70->axis[1].blues;
      uVar21 = 0;
      do {
        *(AF_LatinBlueRec **)(local_178 + uVar21 * 2) = pAVar17;
        uVar21 = uVar21 + 1;
        pAVar17 = pAVar17 + 1;
      } while (uVar35 != uVar21);
      if (uVar35 != 1) {
        uVar21 = 1;
        do {
          iVar40 = (int)uVar21;
          do {
            uVar20 = (int)uVar21 - 1;
            uVar28 = (ulong)uVar20;
            plVar13 = *(long **)(local_178 + uVar28 * 2);
            plVar34 = plVar13;
            if ((*(byte *)(plVar13 + 8) & 6) == 0) {
              plVar34 = plVar13 + 3;
            }
            plVar7 = *(long **)(local_178 + uVar21 * 2);
            plVar37 = plVar7 + 3;
            if ((*(byte *)(plVar7 + 8) & 6) != 0) {
              plVar37 = plVar7;
            }
            if (*plVar34 <= *plVar37) break;
            *(long **)(local_178 + uVar21 * 2) = plVar13;
            *(long **)(local_178 + uVar28 * 2) = plVar7;
            uVar21 = (ulong)uVar20;
          } while (uVar28 != 0);
          uVar20 = iVar40 + 1;
          uVar21 = (ulong)uVar20;
        } while (uVar20 != uVar35);
      }
      if (uVar35 - 1 != 0) {
        uVar21 = 0;
        do {
          lVar27 = *(long *)(local_178 + uVar21 * 2);
          if ((*(byte *)(lVar27 + 0x40) & 6) == 0) {
            lVar30 = 0;
          }
          else {
            lVar30 = 0x18;
          }
          plVar13 = *(long **)(&num_idx_1 + uVar21 * 2);
          if ((*(byte *)(plVar13 + 8) & 6) != 0) {
            plVar13 = plVar13 + 3;
          }
          if (*plVar13 < *(long *)(lVar27 + lVar30)) {
            *(long *)(lVar27 + lVar30) = *plVar13;
          }
          uVar21 = uVar21 + 1;
        } while (uVar35 - 1 != uVar21);
      }
    }
    dummy[0].axis[1].org_delta = 0;
    p = &pAStack_c3d8;
    pAStack_c3d8 = (AF_StyleClass)0x2033203220312030;
    dummy[0].root.style_class = (AF_StyleClass)0x2037203620352034;
    dummy[0].root.scaler.face = (FT_Face)CONCAT44(dummy[0].root.scaler.face._4_4_,0x392038);
    plVar13 = (long *)ft_mem_alloc(pFVar39->memory,8,(FT_Error *)local_178);
    metrics_00 = local_70;
    local_34 = (uint)CONCAT71((int7)((ulong)plVar13 >> 8),1);
    local_50 = (FT_Pos *)0x0;
    local_40 = (AF_LatinAxisRec *)0x0;
    do {
      if (*(char *)p == '\0') break;
      p = (AF_StyleClass *)af_shaper_get_cluster((char *)p,&metrics_00->root,plVar13,local_178);
      if (local_178[0] < 2) {
        lVar27 = *plVar13;
        FVar10 = FT_Get_Advance(((metrics_00->root).globals)->face,(FT_UInt)lVar27,0x803,
                                &dummy[0].axis[1].org_delta);
        if (lVar27 == 0) goto LAB_0023befd;
        bVar45 = (char)local_40 == '\0';
        local_40 = (AF_LatinAxisRec *)CONCAT71((int7)(CONCAT44(extraout_var,FVar10) >> 8),1);
        if (bVar45) {
          bVar45 = false;
          local_50 = (FT_Pos *)dummy[0].axis[1].org_delta;
        }
        else {
          bVar45 = (FT_Pos *)dummy[0].axis[1].org_delta != local_50;
          local_34 = local_34 & 0xff;
          if (bVar45) {
            local_34 = 0;
          }
        }
      }
      else {
LAB_0023befd:
        bVar45 = false;
      }
    } while (!bVar45);
    face = local_78;
    ft_mem_free(local_78->memory,plVar13);
    (local_70->root).digits_have_same_width = (FT_Bool)local_34;
    charmap = local_f0;
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_metrics_init( AF_LatinMetrics  metrics,
                         FT_Face          face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_latin_metrics_init_widths( metrics, face );
      af_latin_metrics_init_blues( metrics, face );
      af_latin_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }